

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

int time_isxmasday(void)

{
  int iVar1;
  tm *ptVar2;
  long in_FS_OFFSET;
  time_t time_data;
  time_t tStack_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  time(&tStack_18);
  ptVar2 = localtime(&tStack_18);
  if ((ptVar2->tm_mon != 0xb) || (iVar1 = 1, 2 < ptVar2->tm_mday - 0x18U)) {
    iVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int time_isxmasday()
{
	time_t time_data;
	struct tm *time_info;

	time(&time_data);
	time_info = localtime(&time_data);
	if(time_info->tm_mon == 11 && time_info->tm_mday >= 24 && time_info->tm_mday <= 26)
		return 1;
	return 0;
}